

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddEssent.c
# Opt level: O1

DdTlcInfo * computeClausesWithUniverse(DdTlcInfo *Cres,DdHalfWord label,short phase)

{
  ulong uVar1;
  DdHalfWord *pDVar2;
  long *plVar3;
  DdHalfWord DVar4;
  uint uVar5;
  DdTlcInfo *t;
  long lVar6;
  DdHalfWord *__ptr;
  long *__s;
  ulong uVar7;
  byte bVar8;
  byte bVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  size_t __size;
  
  pDVar2 = Cres->vars;
  plVar3 = Cres->phases;
  t = (DdTlcInfo *)malloc(0x18);
  if (t == (DdTlcInfo *)0x0) {
    t = (DdTlcInfo *)0x0;
  }
  else {
    t->vars = (DdHalfWord *)0x0;
    t->phases = (long *)0x0;
    t->cnt = 0;
  }
  if (t != (DdTlcInfo *)0x0) {
    lVar12 = 0;
    do {
      lVar6 = lVar12;
      lVar12 = lVar6 + 2;
    } while (pDVar2[lVar6 + 1] != 0 || pDVar2[lVar6] != 0);
    __ptr = (DdHalfWord *)malloc(lVar6 * 4 + 0x10U & 0x3fffffff8);
    if (__ptr != (DdHalfWord *)0x0) {
      __size = (ulong)((int)lVar6 + 3U >> 3 & 0xffffff8) + 8;
      __s = (long *)malloc(__size);
      if (__s == (long *)0x0) {
        __s = (long *)0x0;
      }
      else {
        memset(__s,0,__size);
      }
      if (__s != (long *)0x0) {
        t->vars = __ptr;
        t->phases = __s;
        DVar4 = *pDVar2;
        if (pDVar2[1] == 0 && DVar4 == 0) {
          uVar7 = 0;
          uVar10 = 0;
          bVar8 = 1;
          lVar12 = 1;
        }
        else {
          uVar10 = 0;
          do {
            uVar7 = uVar10;
            __ptr[uVar7] = DVar4;
            __ptr[uVar7 + 1] = pDVar2[uVar7 + 1];
            if (plVar3 == (long *)0x0) {
              uVar10 = 0;
            }
            else {
              uVar10 = (ulong)(((ulong)plVar3[uVar7 >> 6 & 0x3ffffff] >> ((uint)uVar7 & 0x3e) & 1)
                              != 0);
            }
            uVar1 = uVar7 + 1;
            bVar8 = (byte)uVar7 & 0x3e;
            uVar13 = uVar7 >> 6 & 0x3ffffff;
            __s[uVar13] = uVar10 << bVar8 | __s[uVar13] & ~(1L << bVar8);
            if (plVar3 == (long *)0x0) {
              uVar10 = 0;
            }
            else {
              uVar10 = (ulong)(((ulong)plVar3[uVar7 >> 6 & 0x3ffffff] >> (uVar1 & 0x3f) & 1) != 0);
            }
            uVar13 = uVar7 >> 6 & 0x3ffffff;
            __s[uVar13] = uVar10 << ((byte)uVar1 & 0x3f) | __s[uVar13] & ~(1L << (uVar1 & 0x3f));
            uVar10 = uVar7 + 2;
            DVar4 = pDVar2[uVar7 + 2];
          } while (pDVar2[uVar7 + 3] != 0 || DVar4 != 0);
          lVar12 = uVar7 + 3;
          bVar8 = (byte)lVar12 & 0x3f;
          uVar7 = uVar10 & 0xffffffff;
        }
        __ptr[uVar10] = label;
        bVar9 = (byte)uVar7 & 0x3e;
        uVar10 = uVar7 >> 6;
        __s[uVar10] = (long)phase << bVar9 | __s[uVar10] & ~(1L << bVar9);
        __ptr[lVar12] = 0x7fffffff;
        __s[uVar10] = __s[uVar10] | 1L << bVar8;
        uVar11 = (int)uVar7 + 2;
        (__ptr + uVar7 + 2)[0] = 0;
        (__ptr + uVar7 + 2)[1] = 0;
        uVar5 = (int)uVar7 + 3;
        bVar8 = (byte)uVar11 & 0x3e;
        __s[uVar11 >> 6] = __s[uVar11 >> 6] & (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
        bVar8 = (byte)uVar5 & 0x3f;
        __s[uVar5 >> 6] = __s[uVar5 >> 6] & (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
        return t;
      }
      goto LAB_0077b6be;
    }
  }
  __ptr = (DdHalfWord *)0x0;
LAB_0077b6be:
  if (__ptr != (DdHalfWord *)0x0) {
    free(__ptr);
  }
  if (t != (DdTlcInfo *)0x0) {
    Cudd_tlcInfoFree(t);
  }
  return (DdTlcInfo *)0x0;
}

Assistant:

static DdTlcInfo *
computeClausesWithUniverse(
  DdTlcInfo *Cres /* list of clauses for child */,
  DdHalfWord label /* variable labeling the current node */,
  short phase /* 0 if E child is zero; 1 if T child is zero */)
{
    DdHalfWord *Ccv = Cres->vars; /* variables of clauses for child */
    BitVector *Ccp = Cres->phases; /* phases of clauses for child */
    DdHalfWord *Vcv = NULL; /* pointer to the variables of the clauses for v */
    BitVector *Vcp = NULL; /* pointer to the phases of the clauses for v */
    DdTlcInfo *res = NULL; /* the set of clauses to be returned */
    int i;

    /* Initialize result. */
    res = tlcInfoAlloc();
    if (res == NULL) goto cleanup;
    /* Count entries for new list and allocate accordingly. */
    for (i = 0; !sentinelp(Ccv[i], Ccv[i+1]); i += 2);
    /* At this point, i is twice the number of clauses in the child's
    ** list.  We need four more entries for this node: 2 for the one-literal
    ** clause for the label, and 2 for the sentinel. */
    Vcv = ABC_ALLOC(DdHalfWord,i+4);
    if (Vcv == NULL) goto cleanup;
    Vcp = bitVectorAlloc(i+4);
    if (Vcp == NULL) goto cleanup;
    res->vars = Vcv;
    res->phases = Vcp;
    /* Copy old list into new. */
    for (i = 0; !sentinelp(Ccv[i], Ccv[i+1]); i += 2) {
        Vcv[i] = Ccv[i];
        Vcv[i+1] = Ccv[i+1];
        bitVectorSet(Vcp, i, bitVectorRead(Ccp, i));
        bitVectorSet(Vcp, i+1, bitVectorRead(Ccp, i+1));
    }
    /* Add clause corresponding to label. */
    Vcv[i] = label;
    bitVectorSet(Vcp, i, phase);
    i++;
    Vcv[i] = CUDD_MAXINDEX;
    bitVectorSet(Vcp, i, 1);
    i++;
    /* Add sentinel. */
    Vcv[i] = 0;
    Vcv[i+1] = 0;
    bitVectorSet(Vcp, i, 0);
    bitVectorSet(Vcp, i+1, 0);

    return(res);

 cleanup:
    /* Vcp is guaranteed to be NULL here.  Hence, we do not try to free it. */
    if (Vcv != NULL) ABC_FREE(Vcv);
    if (res != NULL) Cudd_tlcInfoFree(res);

    return(NULL);

}